

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.hpp
# Opt level: O3

void __thiscall duckdb::PhysicalOperator::~PhysicalOperator(PhysicalOperator *this)

{
  ~PhysicalOperator(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~PhysicalOperator() {
	}